

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mkmd5resp(char *method,size_t method_len,char *uri,size_t uri_len,char *ha1,size_t ha1_len,
              char *nonce,size_t nonce_len,char *nc,size_t nc_len,char *cnonce,size_t cnonce_len,
              char *qop,size_t qop_len,char *resp)

{
  char ha2 [33];
  
  cs_md5(ha2,method,method_len,":",1,uri,uri_len,0);
  cs_md5(resp,ha1,ha1_len,":",1,nonce,nonce_len,":",1,nc,nc_len,":",1,cnonce,cnonce_len,":",1,qop,
         qop_len,":",1,ha2,0x20,0);
  return;
}

Assistant:

static void mkmd5resp(const char *method, size_t method_len, const char *uri,
                      size_t uri_len, const char *ha1, size_t ha1_len,
                      const char *nonce, size_t nonce_len, const char *nc,
                      size_t nc_len, const char *cnonce, size_t cnonce_len,
                      const char *qop, size_t qop_len, char *resp) {
    static const char colon[] = ":";
    static const size_t one = 1;
    char ha2[33];

    cs_md5(ha2, method, method_len, colon, one, uri, uri_len, NULL);
    cs_md5(resp, ha1, ha1_len, colon, one, nonce, nonce_len, colon, one, nc,
           nc_len, colon, one, cnonce, cnonce_len, colon, one, qop, qop_len,
           colon, one, ha2, sizeof(ha2) - 1, NULL);
}